

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O2

void __thiscall capnp::compiler::Compiler::clearWorkspace(Compiler *this)

{
  Maybe<kj::_::Mutex::Waiter_&> local_10;
  
  kj::MutexGuarded<kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_>::lockExclusive
            ((MutexGuarded<kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_> *)
             &stack0xffffffffffffffe8,&this->impl);
  Impl::clearWorkspace((Impl *)(local_10.ptr)->prev);
  kj::Locked<kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_>::~Locked
            ((Locked<kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_> *)
             &stack0xffffffffffffffe8);
  return;
}

Assistant:

void Compiler::clearWorkspace() const {
  impl.lockExclusive()->get()->clearWorkspace();
}